

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  ImGuiTextRange *pIVar2;
  char *pcVar3;
  ImGuiTextRange *__dest;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ImGuiTextRange input_range;
  ImGuiTextRange local_30;
  
  if ((this->Filters).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar2 = (this->Filters).Data;
    if (pIVar2 != (ImGuiTextRange *)0x0) {
      memcpy(__dest,pIVar2,(long)(this->Filters).Size << 4);
      pIVar2 = (this->Filters).Data;
      if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = 0;
  }
  (this->Filters).Size = 0;
  sVar4 = strlen(this->InputBuf);
  local_30.e = this->InputBuf + sVar4;
  local_30.b = this->InputBuf;
  ImGuiTextRange::split(&local_30,',',&this->Filters);
  this->CountGrep = 0;
  if ((this->Filters).Size != 0) {
    uVar5 = 0;
    do {
      pIVar2 = (this->Filters).Data;
      pcVar6 = pIVar2[uVar5].b;
      pcVar3 = pIVar2[uVar5].e;
      while ((pcVar6 < pcVar3 && ((*pcVar6 == ' ' || (*pcVar6 == '\t'))))) {
        pcVar6 = pcVar6 + 1;
        pIVar2[uVar5].b = pcVar6;
      }
      while (pcVar6 < pcVar3) {
        pcVar7 = pcVar3 + -1;
        if ((*pcVar7 != ' ') && (*pcVar7 != '\t')) break;
        pIVar2[uVar5].e = pcVar7;
        pcVar3 = pcVar7;
      }
      if ((pcVar6 != pcVar3) && (*(this->Filters).Data[uVar5].b != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)(this->Filters).Size);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}